

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

void __thiscall rw::Geometry::buildMeshes(Geometry *this)

{
  int *piVar1;
  uint uVar2;
  Triangle *pTVar3;
  Material **ppMVar4;
  MeshHeader *this_00;
  void *__s;
  MeshHeader *pMVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  if ((this->flags & 0x1000000) != 0) {
    fwrite("WARNING: trying Geometry::buildMeshes() on pre-instanced geometry\n",0x42,1,_stderr);
    return;
  }
  (*DAT_00145dd0)(this->meshHeader);
  this->meshHeader = (MeshHeader *)0x0;
  if ((this->flags & 1) == 0) {
    uVar2 = (this->matList).numMaterials;
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 529"
    ;
    __s = (void *)(*DAT_00145dd8)((long)(int)uVar2 * 4);
    memset(__s,0,(long)(int)uVar2 * 4);
    pTVar3 = this->triangles;
    for (lVar8 = 0; (int)lVar8 < this->numTriangles; lVar8 = lVar8 + 1) {
      piVar1 = (int *)((long)__s + (ulong)pTVar3[lVar8].matId * 4);
      *piVar1 = *piVar1 + 3;
    }
    uVar7 = 0;
    allocateMeshes(this,uVar2,this->numTriangles * 3,0);
    ppMVar4 = (this->matList).materials;
    this_00 = this->meshHeader;
    uVar6 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar6 = uVar7;
    }
    pMVar5 = this_00 + 2;
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      *(Material **)pMVar5 = ppMVar4[uVar7];
      pMVar5[-1].totalIndices = *(uint32 *)((long)__s + uVar7 * 4);
      pMVar5 = (MeshHeader *)&pMVar5[1].totalIndices;
    }
    MeshHeader::setupIndices(this_00);
    (*DAT_00145dd0)(__s);
    for (lVar8 = 0; uVar6 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
      *(undefined4 *)((long)&this_00[1].totalIndices + lVar8) = 0;
    }
    pTVar3 = this->triangles;
    uVar7 = 0;
    uVar6 = (ulong)(uint)this->numTriangles;
    if (this->numTriangles < 1) {
      uVar6 = uVar7;
    }
    for (; (int)uVar6 != (int)uVar7; uVar7 = uVar7 + 1) {
      lVar8 = (ulong)pTVar3[uVar7].matId * 0x18;
      uVar2 = *(uint *)((long)this_00 + lVar8 + 0x18);
      *(uint16 *)(*(long *)((long)this_00 + lVar8 + 0x10) + (ulong)uVar2 * 2) = pTVar3[uVar7].v[0];
      *(uint16 *)
       (*(long *)((long)this_00 + (ulong)pTVar3[uVar7].matId * 0x18 + 0x10) + (ulong)(uVar2 + 1) * 2
       ) = pTVar3[uVar7].v[1];
      *(uint16 *)
       (*(long *)((long)this_00 + (ulong)pTVar3[uVar7].matId * 0x18 + 0x10) + (ulong)(uVar2 + 2) * 2
       ) = pTVar3[uVar7].v[2];
      *(uint *)((long)this_00 + (ulong)pTVar3[uVar7].matId * 0x18 + 0x18) = uVar2 + 3;
    }
    return;
  }
  buildTristrips(this);
  return;
}

Assistant:

void
Geometry::buildMeshes(void)
{
	Triangle *tri;
	Mesh *mesh;

	if(this->flags & Geometry::NATIVE){
		fprintf(stderr, "WARNING: trying Geometry::buildMeshes() on pre-instanced geometry\n");
		return;
	}

	rwFree(this->meshHeader);
	this->meshHeader = nil;
	int32 numMeshes = this->matList.numMaterials;
	if((this->flags & Geometry::TRISTRIP) == 0){
		int32 *numIndices = rwNewT(int32, numMeshes,
			MEMDUR_FUNCTION | ID_GEOMETRY);
		memset(numIndices, 0, numMeshes*sizeof(int32));

		// count indices per mesh
		tri = this->triangles;
		for(int32 i = 0; i < this->numTriangles; i++){
			assert(tri->matId < numMeshes);
			numIndices[tri->matId] += 3;
			tri++;
		}
		// setup meshes
		this->allocateMeshes(numMeshes, this->numTriangles*3, 0);
		mesh = this->meshHeader->getMeshes();
		for(int32 i = 0; i < numMeshes; i++){
			mesh[i].material = this->matList.materials[i];
			mesh[i].numIndices = numIndices[i];
		}
		this->meshHeader->setupIndices();
		rwFree(numIndices);

		// now fill in the indices
		for(int32 i = 0; i < numMeshes; i++)
			mesh[i].numIndices = 0;
		tri = this->triangles;
		for(int32 i = 0; i < this->numTriangles; i++){
			uint32 idx = mesh[tri->matId].numIndices;
			mesh[tri->matId].indices[idx++] = tri->v[0];
			mesh[tri->matId].indices[idx++] = tri->v[1];
			mesh[tri->matId].indices[idx++] = tri->v[2];
			mesh[tri->matId].numIndices = idx;
			tri++;
		}
	}else
		this->buildTristrips();
}